

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O3

adt_u32List_t * adt_u32List_new(void)

{
  adt_u32List_t *paVar1;
  int *piVar2;
  
  paVar1 = (adt_u32List_t *)calloc(1,0x10);
  if (paVar1 == (adt_u32List_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xc;
  }
  return paVar1;
}

Assistant:

adt_u32List_t* adt_u32List_new(void)
{
   adt_u32List_t *self = (adt_u32List_t*) malloc(sizeof(adt_u32List_t));
   if (self != 0)
   {
      adt_u32List_create(self);
   }
   else
   {
      errno = ENOMEM;
   }
   return self;
}